

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_font * nk_font_atlas_add_compressed
                    (nk_font_atlas *atlas,void *compressed_data,nk_size compressed_size,float height
                    ,nk_font_config *config)

{
  nk_plugin_alloc p_Var1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  nk_font *pnVar5;
  long lVar6;
  ulong uVar7;
  uchar *puVar8;
  byte bVar9;
  nk_font_config *pnVar10;
  ushort *puVar11;
  ushort *puVar12;
  byte bVar13;
  long lStack_a0;
  nk_font_config local_88;
  
  bVar13 = 0;
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34ef,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34f0,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34f1,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  p_Var1 = (atlas->permanent).alloc;
  if (p_Var1 == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34f2,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34f3,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (compressed_data == (void *)0x0) {
    __assert_fail("compressed_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34f5,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (compressed_size == 0) {
    __assert_fail("compressed_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34f6,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  uVar2 = nk_decompress_length((uchar *)compressed_data);
  puVar4 = (uchar *)(*p_Var1)((atlas->permanent).userdata,(void *)0x0,(ulong)uVar2);
  if (puVar4 == (uchar *)0x0) {
    __assert_fail("decompressed_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34fd,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  uVar3 = *compressed_data;
  if (((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) !=
       0x57bc0000) ||
     (uVar3 = *(uint *)((long)compressed_data + 4),
     ((uVar3 >> 0x18 != 0 || (uVar3 & 0xff0000) != 0) || (uVar3 & 0xff00) != 0) ||
     (uVar3 & 0xff) != 0)) {
LAB_00122b7a:
    if (config == (nk_font_config *)0x0) {
      nk_font_config(&local_88,height);
    }
    else {
      pnVar10 = &local_88;
      for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
        pnVar10->next = config->next;
        config = (nk_font_config *)((long)config + (ulong)bVar13 * -0x10 + 8);
        pnVar10 = (nk_font_config *)((long)pnVar10 + ((ulong)bVar13 * -2 + 1) * 8);
      }
    }
    local_88.ttf_data_owned_by_atlas = '\x01';
    local_88.ttf_blob = puVar4;
    local_88.ttf_size = (ulong)uVar2;
    local_88.size = height;
    pnVar5 = nk_font_atlas_add(atlas,&local_88);
    return pnVar5;
  }
  uVar3 = nk_decompress_length((uchar *)compressed_data);
  nk__barrier3 = (uchar *)((compressed_size & 0xffffffff) + (long)compressed_data);
  puVar8 = puVar4 + uVar3;
  puVar11 = (ushort *)((long)compressed_data + 0x10);
  nk__barrier2 = (uchar *)compressed_data;
  nk__barrier = puVar8;
  nk__barrier4 = puVar4;
  nk__dout = puVar4;
  do {
    bVar9 = (byte)*puVar11;
    uVar3 = (uint)bVar9;
    if (bVar9 < 0x20) {
      if (bVar9 < 0x18) {
        if (bVar9 < 0x10) {
          if (bVar9 < 8) {
            if (bVar9 != 4) {
              if (uVar3 == 6) {
                uVar7 = ~((ulong)*(byte *)((long)puVar11 + 3) |
                          (ulong)*(byte *)((long)puVar11 + 1) << 0x10 | (ulong)(byte)puVar11[1] << 8
                         );
                uVar3 = (uint)(byte)puVar11[2];
                goto LAB_001229fe;
              }
              if (uVar3 == 7) {
                nk__lit((byte *)((long)puVar11 + 3),
                        (ushort)(*(ushort *)((long)puVar11 + 1) << 8 |
                                *(ushort *)((long)puVar11 + 1) >> 8) + 1);
                uVar7 = (ulong)(ushort)(*(ushort *)((long)puVar11 + 1) << 8 |
                                       *(ushort *)((long)puVar11 + 1) >> 8);
                lStack_a0 = 4;
                goto LAB_00122a76;
              }
              goto LAB_00122b57;
            }
            nk__match(nk__dout +
                      ~((ulong)*(byte *)((long)puVar11 + 3) |
                        (ulong)*(byte *)((long)puVar11 + 1) << 0x10 | (ulong)(byte)puVar11[1] << 8),
                      (ushort)(puVar11[2] << 8 | puVar11[2] >> 8) + 1);
            puVar12 = puVar11 + 3;
          }
          else {
            nk__lit((uchar *)(puVar11 + 1),
                    ((uint)bVar9 * 0x100 + (uint)*(byte *)((long)puVar11 + 1)) - 0x7ff);
            uVar7 = (ulong)(ushort)(*puVar11 << 8 | *puVar11 >> 8);
            lStack_a0 = -0x7fd;
LAB_00122a76:
            puVar12 = (ushort *)((long)puVar11 + uVar7 + lStack_a0);
            if (puVar12 == puVar11) {
              bVar9 = (byte)*puVar11;
LAB_00122b57:
              if ((bVar9 != 5) || (*(byte *)((long)puVar11 + 1) != 0xfa)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                              ,0x33e7,
                              "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              if (nk__dout != puVar8) {
                __assert_fail("nk__dout == output + olen",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                              ,0x33e1,
                              "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              goto LAB_00122b7a;
            }
          }
        }
        else {
          uVar7 = -(ulong)(((uint)*(byte *)((long)puVar11 + 1) * 0x100 +
                           ((uint)(byte)puVar11[1] | (uint)bVar9 << 0x10)) - 0xfffff);
          uVar3 = (uint)(ushort)(*(ushort *)((long)puVar11 + 3) << 8 |
                                *(ushort *)((long)puVar11 + 3) >> 8);
LAB_001229fe:
          nk__match(nk__dout + uVar7,uVar3 + 1);
          puVar12 = (ushort *)((long)puVar11 + 5);
        }
      }
      else {
        nk__match(nk__dout +
                  -(ulong)(((uint)*(byte *)((long)puVar11 + 1) * 0x100 +
                           ((uint)(byte)puVar11[1] | (uint)bVar9 << 0x10)) - 0x17ffff),
                  *(byte *)((long)puVar11 + 3) + 1);
        puVar12 = puVar11 + 2;
      }
    }
    else if ((char)bVar9 < '\0') {
      nk__match(nk__dout + ~(ulong)*(byte *)((long)puVar11 + 1),uVar3 - 0x7f);
      puVar12 = puVar11 + 1;
    }
    else {
      if (bVar9 < 0x40) {
        nk__lit((byte *)((long)puVar11 + 1),uVar3 - 0x1f);
        uVar7 = (ulong)(byte)*puVar11;
        lStack_a0 = -0x1e;
        goto LAB_00122a76;
      }
      nk__match(nk__dout +
                -(ulong)(((uint)*(byte *)((long)puVar11 + 1) + (uint)bVar9 * 0x100) - 0x3fff),
                (byte)puVar11[1] + 1);
      puVar12 = (ushort *)((long)puVar11 + 3);
    }
    puVar11 = puVar12;
    if (puVar8 < nk__dout) {
      __assert_fail("nk__dout <= output + olen",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                    ,0x33eb,
                    "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)");
    }
  } while( true );
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed(struct nk_font_atlas *atlas,
    void *compressed_data, nk_size compressed_size, float height,
    const struct nk_font_config *config)
{
    unsigned int decompressed_size;
    void *decompressed_data;
    struct nk_font_config cfg;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(compressed_data);
    NK_ASSERT(compressed_size);
    if (!atlas || !compressed_data || !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

    decompressed_size = nk_decompress_length((unsigned char*)compressed_data);
    decompressed_data = atlas->permanent.alloc(atlas->permanent.userdata,0,decompressed_size);
    NK_ASSERT(decompressed_data);
    if (!decompressed_data) return 0;
    nk_decompress((unsigned char*)decompressed_data, (unsigned char*)compressed_data,
        (unsigned int)compressed_size);

    cfg = (config) ? *config: nk_font_config(height);
    cfg.ttf_blob = decompressed_data;
    cfg.ttf_size = decompressed_size;
    cfg.size = height;
    cfg.ttf_data_owned_by_atlas = 1;
    return nk_font_atlas_add(atlas, &cfg);
}